

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O3

result<sockpp::none> * __thiscall
sockpp::socket::set_non_blocking(result<sockpp::none> *__return_storage_ptr__,socket *this,bool on)

{
  set_flag(__return_storage_ptr__,this,0x800,on);
  return __return_storage_ptr__;
}

Assistant:

result<> socket::set_non_blocking(bool on /*=true*/) {
#if defined(_WIN32)
    unsigned long mode = on ? 1 : 0;
    auto res = check_res(::ioctlsocket(handle_, FIONBIO, &mode));
    return (res) ? error_code{} : res.error();
#else
    return set_flag(O_NONBLOCK, on);
#endif
}